

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

void mbedtls_ssl_recv_flight_completed(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_ssl_flight_free(ssl->handshake->flight);
  ssl->handshake->flight = (mbedtls_ssl_flight_item *)0x0;
  ssl->handshake->cur_msg = (mbedtls_ssl_flight_item *)0x0;
  ssl->handshake->in_flight_start_seq = ssl->handshake->in_msg_seq;
  (ssl->handshake->buffering).seen_ccs = '\0';
  mbedtls_ssl_buffering_free(ssl);
  mbedtls_ssl_set_timer(ssl,0);
  if ((ssl->in_msgtype == 0x16) && (*ssl->in_msg == '\x14')) {
    ssl->handshake->retransmit_state = '\x03';
  }
  else {
    ssl->handshake->retransmit_state = '\0';
  }
  return;
}

Assistant:

void mbedtls_ssl_recv_flight_completed(mbedtls_ssl_context *ssl)
{
    /* We won't need to resend that one any more */
    mbedtls_ssl_flight_free(ssl->handshake->flight);
    ssl->handshake->flight = NULL;
    ssl->handshake->cur_msg = NULL;

    /* The next incoming flight will start with this msg_seq */
    ssl->handshake->in_flight_start_seq = ssl->handshake->in_msg_seq;

    /* We don't want to remember CCS's across flight boundaries. */
    ssl->handshake->buffering.seen_ccs = 0;

    /* Clear future message buffering structure. */
    mbedtls_ssl_buffering_free(ssl);

    /* Cancel timer */
    mbedtls_ssl_set_timer(ssl, 0);

    if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
        ssl->in_msg[0] == MBEDTLS_SSL_HS_FINISHED) {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_FINISHED;
    } else {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_PREPARING;
    }
}